

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5StorageIntegrityCallback
              (void *pContext,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  int nTerm;
  int iVar1;
  int iVar2;
  u64 uVar3;
  long lVar4;
  int iIdx;
  int local_48;
  int local_44;
  int bPresent;
  Fts5Termset *local_38;
  
  nTerm = 0x8000;
  if (nToken < 0x8000) {
    nTerm = nToken;
  }
  iVar1 = *(int *)((long)pContext + 0xc);
  if ((tflags & 1U) == 0) {
    iVar1 = iVar1 + 1;
  }
  else {
    if (iVar1 != 0) goto LAB_00197929;
    iVar1 = 1;
  }
  *(int *)((long)pContext + 0xc) = iVar1;
LAB_00197929:
  local_38 = *(Fts5Termset **)((long)pContext + 0x18);
  iVar2 = *(int *)(*(long *)((long)pContext + 0x20) + 0x5c);
  local_44 = 0;
  if (iVar2 == 2) {
    local_48 = *(int *)((long)pContext + 8);
  }
  else {
    local_48 = 0;
    if (iVar2 == 0) {
      local_48 = iVar1 + -1;
      local_44 = *(int *)((long)pContext + 8);
    }
  }
  iVar1 = sqlite3Fts5TermsetAdd(local_38,0,pToken,nTerm,&bPresent);
  if (bPresent == 0 && iVar1 == 0) {
    uVar3 = sqlite3Fts5IndexEntryCksum(*pContext,local_44,local_48,0,pToken,nTerm);
    *(ulong *)((long)pContext + 0x10) = *(ulong *)((long)pContext + 0x10) ^ uVar3;
  }
  for (lVar4 = 0; (iVar1 == 0 && (lVar4 < *(int *)(*(long *)((long)pContext + 0x20) + 0x30)));
      lVar4 = lVar4 + 1) {
    iVar2 = sqlite3Fts5IndexCharlenToBytelen
                      (pToken,nTerm,
                       *(int *)(*(long *)(*(long *)((long)pContext + 0x20) + 0x38) + lVar4 * 4));
    if (iVar2 == 0) {
      iVar1 = 0;
    }
    else {
      iIdx = (int)lVar4 + 1;
      iVar1 = sqlite3Fts5TermsetAdd(local_38,iIdx,pToken,iVar2,&bPresent);
      if (bPresent == 0) {
        uVar3 = sqlite3Fts5IndexEntryCksum(*pContext,local_44,local_48,iIdx,pToken,iVar2);
        *(ulong *)((long)pContext + 0x10) = *(ulong *)((long)pContext + 0x10) ^ uVar3;
      }
    }
  }
  return iVar1;
}

Assistant:

static int fts5StorageIntegrityCallback(
  void *pContext,                 /* Pointer to Fts5IntegrityCtx object */
  int tflags,
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iUnused1,                   /* Start offset of token */
  int iUnused2                    /* End offset of token */
){
  Fts5IntegrityCtx *pCtx = (Fts5IntegrityCtx*)pContext;
  Fts5Termset *pTermset = pCtx->pTermset;
  int bPresent;
  int ii;
  int rc = SQLITE_OK;
  int iPos;
  int iCol;

  UNUSED_PARAM2(iUnused1, iUnused2);
  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;

  if( (tflags & FTS5_TOKEN_COLOCATED)==0 || pCtx->szCol==0 ){
    pCtx->szCol++;
  }

  switch( pCtx->pConfig->eDetail ){
    case FTS5_DETAIL_FULL:
      iPos = pCtx->szCol-1;
      iCol = pCtx->iCol;
      break;

    case FTS5_DETAIL_COLUMNS:
      iPos = pCtx->iCol;
      iCol = 0;
      break;

    default:
      assert( pCtx->pConfig->eDetail==FTS5_DETAIL_NONE );
      iPos = 0;
      iCol = 0;
      break;
  }

  rc = sqlite3Fts5TermsetAdd(pTermset, 0, pToken, nToken, &bPresent);
  if( rc==SQLITE_OK && bPresent==0 ){
    pCtx->cksum ^= sqlite3Fts5IndexEntryCksum(
        pCtx->iRowid, iCol, iPos, 0, pToken, nToken
    );
  }

  for(ii=0; rc==SQLITE_OK && ii<pCtx->pConfig->nPrefix; ii++){
    const int nChar = pCtx->pConfig->aPrefix[ii];
    int nByte = sqlite3Fts5IndexCharlenToBytelen(pToken, nToken, nChar);
    if( nByte ){
      rc = sqlite3Fts5TermsetAdd(pTermset, ii+1, pToken, nByte, &bPresent);
      if( bPresent==0 ){
        pCtx->cksum ^= sqlite3Fts5IndexEntryCksum(
            pCtx->iRowid, iCol, iPos, ii+1, pToken, nByte
        );
      }
    }
  }

  return rc;
}